

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmdec.cc
# Opt level: O0

void anon_unknown.dwarf_766b83::reset(WebmInputContext *webm_ctx)

{
  void *pvVar1;
  long *in_RDI;
  Segment *segment;
  MkvReader *reader;
  
  if ((*in_RDI != 0) && ((long *)*in_RDI != (long *)0x0)) {
    (**(code **)(*(long *)*in_RDI + 0x18))();
  }
  if ((in_RDI[1] != 0) && (pvVar1 = (void *)in_RDI[1], pvVar1 != (void *)0x0)) {
    mkvparser::Segment::~Segment((Segment *)webm_ctx);
    operator_delete(pvVar1);
  }
  if ((in_RDI[2] != 0) && ((void *)in_RDI[2] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[2]);
  }
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

void reset(struct WebmInputContext *const webm_ctx) {
  if (webm_ctx->reader != NULL) {
    mkvparser::MkvReader *const reader =
        reinterpret_cast<mkvparser::MkvReader *>(webm_ctx->reader);
    delete reader;
  }
  if (webm_ctx->segment != NULL) {
    mkvparser::Segment *const segment =
        reinterpret_cast<mkvparser::Segment *>(webm_ctx->segment);
    delete segment;
  }
  if (webm_ctx->buffer != NULL) {
    delete[] webm_ctx->buffer;
  }
  webm_ctx->reader = NULL;
  webm_ctx->segment = NULL;
  webm_ctx->buffer = NULL;
  webm_ctx->cluster = NULL;
  webm_ctx->block_entry = NULL;
  webm_ctx->block = NULL;
  webm_ctx->block_frame_index = 0;
  webm_ctx->video_track_index = 0;
  webm_ctx->timestamp_ns = 0;
  webm_ctx->is_key_frame = false;
}